

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O3

void ggml_vec_dot_f32(int n,float *s,size_t bs,float *x,size_t bx,float *y,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_c0 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar2 = n & 0xffffffc0;
  local_100 = local_c0;
  local_140 = local_c0;
  local_180 = local_c0;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    pfVar3 = y;
    pfVar5 = x;
    do {
      lVar6 = 0;
      do {
        auVar8 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pfVar3 + lVar6),
                                     *(undefined1 (*) [64])((long)pfVar5 + lVar6),
                                     *(undefined1 (*) [64])(local_180 + lVar6));
        *(undefined1 (*) [64])(local_180 + lVar6) = auVar8;
        lVar6 = lVar6 + 0x40;
      } while (lVar6 != 0x100);
      uVar4 = uVar4 + 0x40;
      pfVar3 = pfVar3 + 0x40;
      pfVar5 = pfVar5 + 0x40;
    } while (uVar4 < uVar2);
    auVar8 = vaddps_avx512f(local_180,local_100);
    auVar9 = vaddps_avx512f(local_140,local_c0);
    local_c0 = vaddps_avx512f(auVar8,auVar9);
  }
  auVar7 = vextractf64x4_avx512f(local_c0,1);
  auVar8 = vaddps_avx512f(local_c0,ZEXT3264(auVar7));
  auVar10._0_4_ = auVar8._0_4_ + auVar8._16_4_;
  auVar10._4_4_ = auVar8._4_4_ + auVar8._20_4_;
  auVar10._8_4_ = auVar8._8_4_ + auVar8._24_4_;
  auVar10._12_4_ = auVar8._12_4_ + auVar8._28_4_;
  auVar1 = vshufpd_avx(auVar10,auVar10,1);
  auVar11._0_4_ = auVar10._0_4_ + auVar1._0_4_;
  auVar11._4_4_ = auVar10._4_4_ + auVar1._4_4_;
  auVar11._8_4_ = auVar10._8_4_ + auVar1._8_4_;
  auVar11._12_4_ = auVar10._12_4_ + auVar1._12_4_;
  auVar1 = vhaddps_avx(auVar11,auVar11);
  auVar8 = ZEXT1664(auVar1);
  if (uVar2 != n) {
    lVar6 = (long)(int)uVar2;
    do {
      auVar1 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)x[lVar6]),ZEXT416((uint)y[lVar6]));
      auVar8 = ZEXT1664(auVar1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < n);
  }
  *s = auVar8._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_f32(int n, float * GGML_RESTRICT s, size_t bs, const float * GGML_RESTRICT x, size_t bx, const float * GGML_RESTRICT y, size_t by, int nrc) {
   assert(nrc == 1);
   GGML_UNUSED(nrc);
   GGML_UNUSED(bx);
   GGML_UNUSED(by);
   GGML_UNUSED(bs);

#if defined(GGML_SIMD)
    float sumf = 0.0f;
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    ggml_float sumf = 0.0;
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(x[i]*y[i]);
    }
#endif

    *s = sumf;
}